

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make-unique.h
# Opt level: O0

unique_ptr<wabt::interp::FuncType,_std::default_delete<wabt::interp::FuncType>_> __thiscall
wabt::
MakeUnique<wabt::interp::FuncType,std::vector<wabt::Type,std::allocator<wabt::Type>>,std::vector<wabt::Type,std::allocator<wabt::Type>>>
          (wabt *this,vector<wabt::Type,_std::allocator<wabt::Type>_> *args,
          vector<wabt::Type,_std::allocator<wabt::Type>_> *args_1)

{
  FuncType *this_00;
  vector<wabt::Type,_std::allocator<wabt::Type>_> local_50;
  vector<wabt::Type,_std::allocator<wabt::Type>_> local_38;
  vector<wabt::Type,_std::allocator<wabt::Type>_> *local_20;
  vector<wabt::Type,_std::allocator<wabt::Type>_> *args_local_1;
  vector<wabt::Type,_std::allocator<wabt::Type>_> *args_local;
  
  local_20 = args_1;
  args_local_1 = args;
  args_local = (vector<wabt::Type,_std::allocator<wabt::Type>_> *)this;
  this_00 = (FuncType *)operator_new(0x40);
  std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector(&local_38,args_local_1);
  std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector(&local_50,local_20);
  interp::FuncType::FuncType(this_00,&local_38,&local_50);
  std::unique_ptr<wabt::interp::FuncType,std::default_delete<wabt::interp::FuncType>>::
  unique_ptr<std::default_delete<wabt::interp::FuncType>,void>
            ((unique_ptr<wabt::interp::FuncType,std::default_delete<wabt::interp::FuncType>> *)this,
             this_00);
  std::vector<wabt::Type,_std::allocator<wabt::Type>_>::~vector(&local_50);
  std::vector<wabt::Type,_std::allocator<wabt::Type>_>::~vector(&local_38);
  return (__uniq_ptr_data<wabt::interp::FuncType,_std::default_delete<wabt::interp::FuncType>,_true,_true>
          )(__uniq_ptr_data<wabt::interp::FuncType,_std::default_delete<wabt::interp::FuncType>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<T> MakeUnique(Args&&... args) {
  return std::unique_ptr<T>(new T(std::forward<Args>(args)...));
}